

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# replacement_scan-c.cpp
# Opt level: O2

unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true> __thiscall
duckdb::duckdb_capi_replacement_callback
          (duckdb *this,ClientContext *context,ReplacementScanInput *input,
          optional_ptr<duckdb::ReplacementScanData,_true> data)

{
  string *psVar1;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> _Var2;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> _Var3;
  _Head_base<0UL,_duckdb::TableFunctionRef_*,_false> _Var4;
  pointer pVVar5;
  pointer pTVar6;
  BinderException *this_00;
  pointer args;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> local_f0;
  _Head_base<0UL,_duckdb::TableFunctionRef_*,_false> local_e8;
  ParsedExpression *local_e0;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
  children;
  optional_ptr<duckdb::ReplacementScanData,_true> data_local;
  CAPIReplacementScanInfo info;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  psVar1 = input->table_name;
  data_local = data;
  info.data.ptr =
       (CAPIReplacementScanData *)
       optional_ptr<duckdb::ReplacementScanData,_true>::operator->(&data_local);
  info.function_name._M_dataplus._M_p = (pointer)&info.function_name.field_2;
  info.function_name._M_string_length = 0;
  info.function_name.field_2._M_local_buf[0] = '\0';
  info.parameters.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  info.parameters.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  info.parameters.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  info.error._M_dataplus._M_p = (pointer)&info.error.field_2;
  info.error._M_string_length = 0;
  info.error.field_2._M_local_buf[0] = '\0';
  (*(info.data.ptr)->callback)
            ((duckdb_replacement_scan_info)&info,(psVar1->_M_dataplus)._M_p,
             (info.data.ptr)->extra_data);
  if (info.error._M_string_length == 0) {
    if (info.function_name._M_string_length == 0) {
      *(undefined8 *)this = 0;
    }
    else {
      make_uniq<duckdb::TableFunctionRef>();
      pVVar5 = info.parameters.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
               super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
               super__Vector_impl_data._M_finish;
      children.
      super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      children.
      super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      children.
      super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      .
      super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      for (args = info.parameters.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
                  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                  super__Vector_impl_data._M_start; args != pVVar5; args = args + 1) {
        make_uniq<duckdb::ConstantExpression,duckdb::Value>((duckdb *)&local_e0,args);
        local_f0._M_head_impl = local_e0;
        local_e0 = (ParsedExpression *)0x0;
        ::std::
        vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                    *)&children,
                   (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                    *)&local_f0);
        if (local_f0._M_head_impl != (ParsedExpression *)0x0) {
          (*((local_f0._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
        }
        local_f0._M_head_impl = (ParsedExpression *)0x0;
        if (local_e0 != (ParsedExpression *)0x0) {
          (*(local_e0->super_BaseExpression)._vptr_BaseExpression[1])();
        }
      }
      make_uniq<duckdb::FunctionExpression,std::__cxx11::string&,duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,true>>
                ((duckdb *)&local_f0,&info.function_name,&children);
      _Var3._M_head_impl = local_f0._M_head_impl;
      local_f0._M_head_impl = (ParsedExpression *)0x0;
      pTVar6 = unique_ptr<duckdb::TableFunctionRef,_std::default_delete<duckdb::TableFunctionRef>,_true>
               ::operator->((unique_ptr<duckdb::TableFunctionRef,_std::default_delete<duckdb::TableFunctionRef>,_true>
                             *)&local_e8);
      _Var2._M_head_impl =
           (pTVar6->function).
           super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
           ._M_t.
           super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
           .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
      (pTVar6->function).
      super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
      _M_t.
      super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
      .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl = _Var3._M_head_impl;
      if (_Var2._M_head_impl != (ParsedExpression *)0x0) {
        (**(code **)(*(long *)&(_Var2._M_head_impl)->super_BaseExpression + 8))();
      }
      if (local_f0._M_head_impl != (ParsedExpression *)0x0) {
        (*((local_f0._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
      }
      _Var4._M_head_impl = local_e8._M_head_impl;
      local_e8._M_head_impl = (TableFunctionRef *)0x0;
      *(TableFunctionRef **)this = _Var4._M_head_impl;
      ::std::
      vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
      ::~vector(&children.
                 super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
               );
      if (local_e8._M_head_impl != (TableFunctionRef *)0x0) {
        (*((local_e8._M_head_impl)->super_TableRef)._vptr_TableRef[1])();
      }
    }
    CAPIReplacementScanInfo::~CAPIReplacementScanInfo(&info);
    return (unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>)
           (unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>)this;
  }
  this_00 = (BinderException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&children,"Error in replacement scan: %s\n",(allocator *)&local_e8);
  ::std::__cxx11::string::string((string *)&local_50,(string *)&info.error);
  BinderException::BinderException<std::__cxx11::string>(this_00,(string *)&children,&local_50);
  __cxa_throw(this_00,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

unique_ptr<TableRef> duckdb_capi_replacement_callback(ClientContext &context, ReplacementScanInput &input,
                                                      optional_ptr<ReplacementScanData> data) {
	auto &table_name = input.table_name;
	auto &scan_data = data->Cast<CAPIReplacementScanData>();

	CAPIReplacementScanInfo info(&scan_data);
	scan_data.callback((duckdb_replacement_scan_info)&info, table_name.c_str(), scan_data.extra_data);
	if (!info.error.empty()) {
		throw BinderException("Error in replacement scan: %s\n", info.error);
	}
	if (info.function_name.empty()) {
		// no function provided: bail-out
		return nullptr;
	}
	auto table_function = make_uniq<TableFunctionRef>();
	vector<unique_ptr<ParsedExpression>> children;
	for (auto &param : info.parameters) {
		children.push_back(make_uniq<ConstantExpression>(std::move(param)));
	}
	table_function->function = make_uniq<FunctionExpression>(info.function_name, std::move(children));
	return std::move(table_function);
}